

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::
Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<DataStream_&,_TransactionSerParams> *s,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *v)

{
  long lVar1;
  iterator __position;
  uint64_t uVar2;
  pointer psVar3;
  uint64_t __n;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(v);
  uVar2 = ReadCompactSize<ParamsStream<DataStream&,TransactionSerParams>>(s,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar4 = __n + 0x4c4b4;
      __n = uVar2;
      if (uVar4 < uVar2) {
        __n = uVar4;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::reserve(v,__n);
      while (__position._M_current =
                  (v->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish,
            (ulong)((long)__position._M_current -
                    (long)(v->
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4) < __n) {
        if (__position._M_current ==
            (v->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_realloc_insert<>(v,__position);
          psVar3 = (v->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((__position._M_current)->
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)0x0;
          ((__position._M_current)->
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          psVar3 = (v->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (v->
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = psVar3;
        }
        Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>(s,psVar3 + -1);
      }
    } while (uVar4 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }